

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O2

void __thiscall
QMarkdownTextEdit::QMarkdownTextEdit(QMarkdownTextEdit *this,QWidget *parent,bool initHighlighter)

{
  int iVar1;
  QObject *pQVar2;
  LineNumArea *this_00;
  MarkdownHighlighter *this_01;
  QTextDocument *parent_00;
  QVBoxLayout *this_02;
  QPlainTextEditSearchWidget *this_03;
  QWidget *pQVar3;
  void **ppvVar4;
  undefined4 *puVar5;
  offset_in_QTextDocument_to_subr signal;
  QMarkdownTextEdit *pQVar6;
  ConnectionType type;
  ulong uVar7;
  int *piVar8;
  code *local_80;
  undefined8 uStack_78;
  QFontMetrics metrics;
  Object local_68 [8];
  Object local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  Object local_48 [8];
  Object local_40 [8];
  QFont font;
  
  QPlainTextEdit::QPlainTextEdit(&this->super_QPlainTextEdit,parent);
  *(undefined ***)this = &PTR_metaObject_001586b0;
  *(undefined ***)&this->field_0x10 = &PTR__QMarkdownTextEdit_001588b8;
  QTextCursor::QTextCursor(&this->_textCursor);
  this->_highlighter = (MarkdownHighlighter *)0x0;
  (this->_ignoredClickUrlSchemata).d.size = 0;
  (this->_ignoredClickUrlSchemata).d.d = (Data *)0x0;
  (this->_ignoredClickUrlSchemata).d.ptr = (QString *)0x0;
  (this->_currentLineHighlightColor).cspec = Invalid;
  (this->_autoTextOptions).i = 0;
  *(undefined4 *)((long)&(this->_autoTextOptions).i + 3) = 0;
  (this->_currentLineHighlightColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->_currentLineHighlightColor).ct + 2) = 0;
  this->_debounceDelay = 0;
  this->_lineNumberLeftMarginOffset = 0;
  QObject::installEventFilter((QObject *)this);
  pQVar2 = (QObject *)QAbstractScrollArea::viewport();
  QObject::installEventFilter(pQVar2);
  (this->_autoTextOptions).i = 1;
  this_00 = (LineNumArea *)operator_new(0x58);
  pQVar6 = this;
  LineNumArea::LineNumArea(this_00,this);
  this->_lineNumArea = this_00;
  updateLineNumberAreaWidth(this,(int)pQVar6);
  this->_highlightingEnabled = initHighlighter;
  if (initHighlighter) {
    this_01 = (MarkdownHighlighter *)operator_new(0x58);
    parent_00 = (QTextDocument *)QPlainTextEdit::document();
    MarkdownHighlighter::MarkdownHighlighter(this_01,parent_00,(HighlightingOptions)0x0);
    this->_highlighter = this_01;
  }
  QFont::QFont(&font,(QFont *)(*(long *)&this->field_0x20 + 0x38));
  QFontMetrics::QFontMetrics(&metrics,&font);
  iVar1 = QFontMetrics::horizontalAdvance((QChar)(char16_t)&metrics);
  QPlainTextEdit::setTabStopDistance((double)(iVar1 << 2));
  this_02 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_02,(QWidget *)this);
  QLayout::setContentsMargins((int)this_02,0,0,0);
  QBoxLayout::addStretch((int)this_02);
  QWidget::setLayout((QLayout *)this);
  this_03 = (QPlainTextEditSearchWidget *)operator_new(0x98);
  QPlainTextEditSearchWidget::QPlainTextEditSearchWidget
            ((QPlainTextEditSearchWidget *)this_03,&this->super_QPlainTextEdit);
  this->_searchWidget = this_03;
  pQVar3 = (QWidget *)QWidget::layout();
  QLayout::addWidget(pQVar3);
  local_80 = adjustRightMargin;
  uStack_78 = 0;
  type = (ConnectionType)this;
  QObject::connect<void(QPlainTextEdit::*)(),void(QMarkdownTextEdit::*)()>
            (local_40,(offset_in_QPlainTextEdit_to_subr)this,(Object *)QPlainTextEdit::textChanged,0
             ,type);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  local_80 = centerTheCursor;
  uStack_78 = 0;
  uVar7 = 0;
  QObject::connect<void(QPlainTextEdit::*)(),void(QMarkdownTextEdit::*)()>
            (local_48,(offset_in_QPlainTextEdit_to_subr)this,
             (Object *)QPlainTextEdit::cursorPositionChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  ppvVar4 = (void **)QAbstractScrollArea::verticalScrollBar();
  local_80 = QAbstractSlider::valueChanged;
  uStack_78 = 0;
  puVar5 = (undefined4 *)operator_new(0x18);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]qt-markdown-textedit/qmarkdowntextedit.cpp:88:67),_1,_QtPrivate::List<int>,_void>
       ::impl;
  *(QMarkdownTextEdit **)(puVar5 + 4) = this;
  piVar8 = (int *)(uVar7 & 0xffffffff00000000);
  QObject::connectImpl
            (local_50,ppvVar4,(QObject *)&local_80,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar5,piVar8,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  local_80 = QPlainTextEdit::cursorPositionChanged;
  uStack_78 = 0;
  puVar5 = (undefined4 *)operator_new(0x18);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]qt-markdown-textedit/qmarkdowntextedit.cpp:91:65),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(QMarkdownTextEdit **)(puVar5 + 4) = this;
  QObject::connectImpl
            (local_58,(void **)this,(QObject *)&local_80,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar5,(int *)((ulong)piVar8 & 0xffffffff00000000),(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  signal = QPlainTextEdit::document();
  local_80 = updateLineNumberAreaWidth;
  uStack_78 = 0;
  QObject::connect<void(QTextDocument::*)(int),void(QMarkdownTextEdit::*)(int)>
            (local_60,signal,(Object *)QTextDocument::blockCountChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  local_80 = updateLineNumberArea;
  uStack_78 = 0;
  QObject::connect<void(QPlainTextEdit::*)(QRect_const&,int),void(QMarkdownTextEdit::*)(QRect,int)>
            (local_68,(offset_in_QPlainTextEdit_to_subr)this,(Object *)QPlainTextEdit::updateRequest
             ,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  updateSettings(this);
  QTimer::singleShot<int,void(QMarkdownTextEdit::*)()>
            ((QTimer *)0x12c,type,(Object *)adjustRightMargin,0);
  QFontMetrics::~QFontMetrics(&metrics);
  QFont::~QFont(&font);
  return;
}

Assistant:

QMarkdownTextEdit::QMarkdownTextEdit(QWidget *parent, bool initHighlighter)
    : QPlainTextEdit(parent) {
    installEventFilter(this);
    viewport()->installEventFilter(this);
    _autoTextOptions = AutoTextOption::BracketClosing;

    _lineNumArea = new LineNumArea(this);
    updateLineNumberAreaWidth(0);

    // markdown highlighting is enabled by default
    _highlightingEnabled = initHighlighter;
    if (initHighlighter) {
        _highlighter = new MarkdownHighlighter(document());
    }

    QFont font = this->font();

    // set the tab stop to the width of 4 spaces in the editor
    constexpr int tabStop = 4;
    QFontMetrics metrics(font);

#if QT_VERSION < QT_VERSION_CHECK(5, 11, 0)
    setTabStopWidth(tabStop * metrics.width(' '));
#else
    setTabStopDistance(tabStop * metrics.horizontalAdvance(QLatin1Char(' ')));
#endif

    // add shortcuts for duplicating text
    //    new QShortcut( QKeySequence( "Ctrl+D" ), this, SLOT( duplicateText() )
    //    ); new QShortcut( QKeySequence( "Ctrl+Alt+Down" ), this, SLOT(
    //    duplicateText() ) );

    // add a layout to the widget
    auto *layout = new QVBoxLayout(this);
    layout->setContentsMargins(0, 0, 0, 0);
    layout->addStretch();
    this->setLayout(layout);

    // add the hidden search widget
    _searchWidget = new QPlainTextEditSearchWidget(this);
    this->layout()->addWidget(_searchWidget);

    connect(this, &QPlainTextEdit::textChanged, this,
            &QMarkdownTextEdit::adjustRightMargin);
    connect(this, &QPlainTextEdit::cursorPositionChanged, this,
            &QMarkdownTextEdit::centerTheCursor);
    connect(verticalScrollBar(), &QScrollBar::valueChanged, this, [this](int) {
        _lineNumArea->update();
    });
    connect(this, &QPlainTextEdit::cursorPositionChanged, this, [this]() {
        _lineNumArea->update();

        auto oldArea = blockBoundingGeometry(_textCursor.block()).translated(contentOffset());
        _textCursor = textCursor();
        auto newArea = blockBoundingGeometry(_textCursor.block()).translated(contentOffset());
        auto areaToUpdate = oldArea | newArea;
        viewport()->update(areaToUpdate.toRect());
    });
    connect(document(), &QTextDocument::blockCountChanged,
            this, &QMarkdownTextEdit::updateLineNumberAreaWidth);
    connect(this, &QPlainTextEdit::updateRequest,
            this, &QMarkdownTextEdit::updateLineNumberArea);

    updateSettings();

    // workaround for disabled signals up initialization
    QTimer::singleShot(300, this, &QMarkdownTextEdit::adjustRightMargin);
}